

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synapse.cxx
# Opt level: O2

string * __thiscall
SimpleSynapse::getParameter(string *__return_storage_ptr__,SimpleSynapse *this,string *name)

{
  bool bVar1;
  long lVar2;
  stringstream param;
  stringstream local_1a0 [392];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  bVar1 = std::operator==(name,"time-constant");
  lVar2 = 0x168;
  if (!bVar1) {
    bVar1 = std::operator==(name,"peak-conductance");
    lVar2 = 0x160;
    if (!bVar1) {
      Synapse::getParameter(__return_storage_ptr__,&this->super_Synapse,name);
      goto LAB_00141720;
    }
  }
  std::ostream::_M_insert<double>
            (*(double *)
              ((long)&(this->super_Synapse).super_StochasticFunction.super_StochasticProcess.
                      super_Parametric._vptr_Parametric + lVar2));
  std::__cxx11::stringbuf::str();
LAB_00141720:
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string SimpleSynapse::getParameter( const string& name ) const
{
	stringstream param;
	if (name == "time-constant")
		param << simpleTimeConstant;
	else if (name == "peak-conductance")
		param << simplePeakCnd;
	else
		return Synapse::getParameter(name);
	
	return param.str();
}